

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O0

void __thiscall
wallet::LegacyScriptPubKeyMan::LegacyScriptPubKeyMan
          (LegacyScriptPubKeyMan *this,WalletStorage *storage,int64_t keypool_size)

{
  long lVar1;
  undefined8 in_RDX;
  map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LegacyDataSPKM::ScriptPubKeyMan(&this->super_LegacyDataSPKM,storage);
  *(undefined ***)&(in_RDI->_M_t)._M_impl = &PTR__LegacyScriptPubKeyMan_016153d8;
  in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&PTR__LegacyScriptPubKeyMan_01615518;
  in_RDI[0x10]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&in_RDI[0x11]._M_t._M_impl = 0x7fffffffffffffff;
  *(undefined8 *)&in_RDI[0x11]._M_t._M_impl.super__Rb_tree_header._M_header = in_RDX;
  std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::map
            (in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

LegacyScriptPubKeyMan(WalletStorage& storage, int64_t keypool_size) : LegacyDataSPKM(storage), m_keypool_size(keypool_size) {}